

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdGetTxIn(void *handle,int net_type,char *tx_hex_string,uint32_t index,char **txid,
              uint32_t *vout,uint32_t *sequence,char **script_sig)

{
  bool bVar1;
  CfdException *this;
  char *work_txid;
  Txid temp_txid;
  Script temp_unlocking_script;
  TransactionContext tx;
  TxInReference ref;
  bool local_309;
  char *local_308;
  char *local_300;
  Script local_2f8;
  Txid local_2c0;
  Script local_2a0;
  undefined1 local_268 [40];
  uint32_t local_240;
  Script local_238;
  uint32_t local_200;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  uint32_t local_e0;
  Script local_d8;
  uint32_t local_a0;
  
  local_300 = (char *)0x0;
  local_308 = (char *)0x0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    local_309 = false;
    cfd::capi::ConvertNetType(net_type,&local_309);
    cfd::core::Txid::Txid(&local_2c0);
    cfd::core::Script::Script(&local_2a0);
    if (local_309 == true) {
      std::__cxx11::string::string((string *)local_108,tx_hex_string,(allocator *)&local_2f8);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)local_268,(string *)local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != &local_f8) {
        operator_delete((void *)local_108._0_8_,local_f8._M_allocated_capacity + 1);
      }
      cfd::core::Transaction::GetTxIn((TxInReference *)local_108,(Transaction *)local_268,index);
      cfd::core::Txid::Txid((Txid *)&local_2f8,(Txid *)(local_108 + 8));
      cfd::core::Txid::operator=(&local_2c0,(Txid *)&local_2f8);
      local_2f8._vptr_Script = (_func_int **)&PTR__Txid_0087c9b8;
      if (local_2f8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2f8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2f8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2f8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      cfd::core::Script::Script(&local_2f8,&local_d8);
      cfd::core::Script::operator=(&local_2a0,&local_2f8);
      cfd::core::Script::~Script(&local_2f8);
      if (vout != (uint32_t *)0x0) {
        *vout = local_e0;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = local_a0;
      }
      cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_108);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)local_268);
    }
    else {
      std::__cxx11::string::string((string *)local_268,tx_hex_string,(allocator *)&local_2f8);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_108,(string *)local_268);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
      cfd::core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)local_268,(ConfidentialTransaction *)local_108,index);
      cfd::core::Txid::Txid((Txid *)&local_2f8,(Txid *)(local_268 + 8));
      cfd::core::Txid::operator=(&local_2c0,(Txid *)&local_2f8);
      local_2f8._vptr_Script = (_func_int **)&PTR__Txid_0087c9b8;
      if (local_2f8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2f8.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2f8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2f8.script_data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      cfd::core::Script::Script(&local_2f8,&local_238);
      cfd::core::Script::operator=(&local_2a0,&local_2f8);
      cfd::core::Script::~Script(&local_2f8);
      if (vout != (uint32_t *)0x0) {
        *vout = local_240;
      }
      if (sequence != (uint32_t *)0x0) {
        *sequence = local_200;
      }
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_268);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_108);
    }
    if (txid != (char **)0x0) {
      cfd::core::Txid::GetHex_abi_cxx11_((string *)local_268,&local_2c0);
      local_300 = cfd::capi::CreateString((string *)local_268);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
    }
    if (script_sig != (char **)0x0) {
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_268,&local_2a0);
      local_308 = cfd::capi::CreateString((string *)local_268);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
    }
    if (local_300 != (char *)0x0) {
      *txid = local_300;
    }
    if (local_308 != (char *)0x0) {
      *script_sig = local_308;
    }
    cfd::core::Script::~Script(&local_2a0);
    local_2c0._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
    if (local_2c0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c0.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c0.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_268._0_8_ = "cfdcapi_transaction.cpp";
  local_268._8_4_ = 0x9cf;
  local_268._16_8_ = "CfdGetTxIn";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_268,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_268._0_8_ = local_268 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_268);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxIn(
    void* handle, int net_type, const char* tx_hex_string, uint32_t index,
    char** txid, uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    Txid temp_txid;
    Script temp_unlocking_script;
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(index);
      temp_txid = ref.GetTxid();
      temp_unlocking_script = ref.GetUnlockingScript();
      if (vout != nullptr) *vout = ref.GetVout();
      if (sequence != nullptr) *sequence = ref.GetSequence();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (txid != nullptr) {
      work_txid = CreateString(temp_txid.GetHex());
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(temp_unlocking_script.GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_txid, &work_script_sig);
  return result;
}